

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do.c
# Opt level: O0

void heal_legs(void)

{
  char *pcVar1;
  
  if ((u.uprops[0x20].intrinsic != 0) || (u.uprops[0x20].extrinsic != 0)) {
    if (u.atemp.a[3] < '\0') {
      u.atemp.a[3] = u.atemp.a[3] + '\x01';
      iflags.botl = '\x01';
    }
    if (u.usteed == (monst *)0x0) {
      if ((u.uprops[0x20].extrinsic & 0x60000) == 0x60000) {
        pcVar1 = body_part(9);
        pcVar1 = makeplural(pcVar1);
        pline("Your %s feel somewhat better.",pcVar1);
      }
      else {
        pcVar1 = body_part(9);
        pline("Your %s feels somewhat better.",pcVar1);
      }
    }
    u.uprops[0x20].extrinsic = 0;
    u.uprops[0x20].intrinsic = 0;
  }
  encumber_msg();
  return;
}

Assistant:

void heal_legs(void)
{
	if (Wounded_legs) {
		if (ATEMP(A_DEX) < 0) {
			ATEMP(A_DEX)++;
			iflags.botl = 1;
		}

		if (!u.usteed)
		{
			/* KMH, intrinsics patch */
			if ((EWounded_legs & BOTH_SIDES) == BOTH_SIDES) {
			pline("Your %s feel somewhat better.",
				makeplural(body_part(LEG)));
		} else {
			pline("Your %s feels somewhat better.",
				body_part(LEG));
		}
		}
		HWounded_legs = EWounded_legs = 0;
	}
	encumber_msg();
}